

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::DebugFindPkgRAII::DebugFindPkgRAII(DebugFindPkgRAII *this,cmMakefile *mf,string *pkg)

{
  bool bVar1;
  
  this->Makefile = mf;
  this->OldValue = mf->DebugFindPkg;
  bVar1 = cmake::GetDebugFindPkgOutput(mf->GlobalGenerator->CMakeInstance,pkg);
  this->Makefile->DebugFindPkg = bVar1;
  return;
}

Assistant:

cmMakefile::DebugFindPkgRAII::DebugFindPkgRAII(cmMakefile* mf,
                                               std::string const& pkg)
  : Makefile(mf)
  , OldValue(this->Makefile->DebugFindPkg)
{
  this->Makefile->DebugFindPkg =
    this->Makefile->GetCMakeInstance()->GetDebugFindPkgOutput(pkg);
}